

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_gettable(lua_State *L,int idx)

{
  TValue *t;
  
  t = index2adr(L,idx);
  luaV_gettable(L,t,L->top + -1,L->top + -1);
  return;
}

Assistant:

LUA_API void lua_gettable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2adr(L, idx);
  api_checkvalidindex(L, t);
  luaV_gettable(L, t, L->top - 1, L->top - 1);
  lua_unlock(L);
}